

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSeq.c
# Opt level: O3

Vec_Ptr_t * Sim_SimulateSeqRandom(Abc_Ntk_t *pNtk,int nFrames,int nWords)

{
  void *pvVar1;
  Vec_Ptr_t *vInfo;
  Abc_Obj_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSeq.c"
                  ,0x38,"Vec_Ptr_t *Sim_SimulateSeqRandom(Abc_Ntk_t *, int, int)");
  }
  iVar4 = nWords * nFrames;
  vInfo = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,iVar4,0);
  pAVar2 = Abc_AigConst1(pNtk);
  Sim_UtilSetConst((uint *)vInfo->pArray[pAVar2->Id],iVar4,1);
  pVVar3 = pNtk->vPis;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      Sim_UtilSetRandom((uint *)vInfo->pArray[*(int *)((long)pVVar3->pArray[lVar5] + 0x10)],iVar4);
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vPis;
    } while (lVar5 < pVVar3->nSize);
  }
  pVVar3 = pNtk->vBoxes;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar5];
      if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8) {
        if (*(long *)((long)pvVar1 + 0x38) == 2) {
          iVar4 = 1;
        }
        else {
          if (*(long *)((long)pvVar1 + 0x38) != 1) {
            Sim_UtilSetRandom((uint *)vInfo->pArray[*(int *)((long)pvVar1 + 0x10)],nWords);
            goto LAB_004d271e;
          }
          iVar4 = 0;
        }
        Sim_UtilSetConst((uint *)vInfo->pArray[*(int *)((long)pvVar1 + 0x10)],nWords,iVar4);
      }
LAB_004d271e:
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vBoxes;
    } while (lVar5 < pVVar3->nSize);
  }
  if (0 < nFrames) {
    iVar4 = 0;
    do {
      Sim_SimulateSeqFrame(vInfo,pNtk,iVar4,nWords,(uint)(iVar4 < nFrames + -1));
      iVar4 = iVar4 + 1;
    } while (nFrames != iVar4);
  }
  return vInfo;
}

Assistant:

Vec_Ptr_t * Sim_SimulateSeqRandom( Abc_Ntk_t * pNtk, int nFrames, int nWords )
{
    Vec_Ptr_t * vInfo;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    vInfo = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nWords * nFrames, 0 );
    // set the constant data
    pNode = Abc_AigConst1(pNtk);
    Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nWords * nFrames, 1 );
    // set the random PI data
    Abc_NtkForEachPi( pNtk, pNode, i )
        Sim_UtilSetRandom( Sim_SimInfoGet(vInfo,pNode), nWords * nFrames );
    // set the initial state data
    Abc_NtkForEachLatch( pNtk, pNode, i )
        if ( Abc_LatchIsInit0(pNode) )
            Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nWords, 0 );
        else if ( Abc_LatchIsInit1(pNode) )
            Sim_UtilSetConst( Sim_SimInfoGet(vInfo,pNode), nWords, 1 );
        else 
            Sim_UtilSetRandom( Sim_SimInfoGet(vInfo,pNode), nWords );
    // simulate the nodes for the given number of timeframes
    for ( i = 0; i < nFrames; i++ )
        Sim_SimulateSeqFrame( vInfo, pNtk, i, nWords, (int)(i < nFrames-1) );
    return vInfo;
}